

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

void __thiscall
helics::CustomMessageOperator::CustomMessageOperator
          (CustomMessageOperator *this,
          function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
          *userMessageFunction)

{
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__CustomMessageOperator_0044be30;
  std::
  function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  ::function(&this->messageFunction,userMessageFunction);
  return;
}

Assistant:

CustomMessageOperator::CustomMessageOperator(
    std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction):
    messageFunction(std::move(userMessageFunction))
{
}